

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

bb_insn_t_conflict get_fake_insn(gen_ctx_t gen_ctx,VARR_bb_insn_t *fake_insns,MIR_reg_t reg)

{
  bb_t_conflict bb;
  MIR_context_t ctx;
  MIR_type_t MVar1;
  size_t sVar2;
  bb_insn_t_conflict obj;
  MIR_insn_t_conflict insn;
  MIR_insn_code_t code;
  ulong ix;
  
  bb = (gen_ctx->curr_cfg->bbs).head;
  if (bb->index != 0) {
    __assert_fail("bb->index == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x897,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
  }
  ctx = gen_ctx->ctx;
  _MIR_new_var_op(ctx,reg);
  ix = (ulong)reg;
  while (sVar2 = VARR_bb_insn_tlength(fake_insns), sVar2 <= ix) {
    VARR_bb_insn_tpush(fake_insns,(bb_insn_t_conflict)0x0);
  }
  obj = VARR_bb_insn_tget(fake_insns,ix);
  if (obj == (bb_insn_t_conflict)0x0) {
    if (reg < 0x22) {
      __assert_fail("reg > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x89b,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
    }
    MVar1 = MIR_reg_type(ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
    if (MVar1 == MIR_T_F) {
      code = MIR_FMOV;
    }
    else if (MVar1 == MIR_T_D) {
      code = MIR_DMOV;
    }
    else {
      code = (uint)(MVar1 == MIR_T_LD) * 3;
    }
    insn = MIR_new_insn(ctx,code);
    obj = create_bb_insn(gen_ctx,insn,bb);
    VARR_bb_insn_tset(fake_insns,ix,obj);
  }
  return obj;
}

Assistant:

static bb_insn_t get_fake_insn (gen_ctx_t gen_ctx, VARR (bb_insn_t) * fake_insns, MIR_reg_t reg) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  MIR_op_t op;
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); /* enter bb */

  gen_assert (bb->index == 0); /* enter bb */
  op = _MIR_new_var_op (ctx, reg);
  while (VARR_LENGTH (bb_insn_t, fake_insns) <= reg) VARR_PUSH (bb_insn_t, fake_insns, NULL);
  if ((bb_insn = VARR_GET (bb_insn_t, fake_insns, reg)) == NULL) {
    gen_assert (reg > MAX_HARD_REG);
    type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
    insn = MIR_new_insn (ctx, get_move_code (type), op, op);
    bb_insn = create_bb_insn (gen_ctx, insn, bb);
    VARR_SET (bb_insn_t, fake_insns, reg, bb_insn);
  }
  return bb_insn;
}